

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O0

void flatten_concat_expression(CompilerState *compiler_state,AstNode *node)

{
  undefined1 local_40 [8];
  PtrListIterator eiter__;
  AstNode *e;
  AstNodeList *expr_list;
  AstNode *node_local;
  CompilerState *compiler_state_local;
  
  expr_list = (AstNodeList *)node;
  node_local = (AstNode *)compiler_state;
  if ((node->type == EXPR_BINARY) && ((node->field_2).unary_expr.unary_op == 0xc)) {
    e = (AstNode *)0x0;
    walk_binary_expr(compiler_state,node,(AstNodeList **)&e);
    *(undefined4 *)expr_list = 0x1a;
    expr_list->list_[0] = (AstNode *)0x0;
    expr_list->list_[0] = (AstNode *)0x0;
    expr_list->list_[0] = e;
    *(undefined4 *)&expr_list->prev_ = 0x101;
    raviX_ptrlist_forward_iterator((PtrListIterator *)local_40,(PtrList *)e);
    eiter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_40);
    while( true ) {
      if (eiter__._16_8_ == 0) {
        return;
      }
      if (((*(int *)(eiter__._16_8_ + 8) != 0x101) && (*(int *)(eiter__._16_8_ + 8) != 0x10)) &&
         (*(int *)(eiter__._16_8_ + 8) != 0x10)) break;
      eiter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_40);
    }
    *(undefined4 *)&expr_list->prev_ = 0xffffffff;
    return;
  }
  __assert_fail("node->type == EXPR_BINARY && node->binary_expr.binary_op == BINOPR_CONCAT",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/ast_simplify.c"
                ,0x184,"void flatten_concat_expression(CompilerState *, AstNode *)");
}

Assistant:

static void flatten_concat_expression(CompilerState *compiler_state, AstNode *node) {
	assert(node->type == EXPR_BINARY && node->binary_expr.binary_op == BINOPR_CONCAT);
	AstNodeList  *expr_list = NULL;
	walk_binary_expr(compiler_state, node, &expr_list);
	node->type = EXPR_CONCAT;
	node->binary_expr.expr_left = NULL;
	node->binary_expr.expr_left = NULL;
	node->string_concatenation_expr.expr_list = expr_list;
	node->common_expr.type.type_code = RAVI_TSTRING; /* assume string  */
	AstNode *e;
	FOR_EACH_PTR(expr_list, AstNode, e) {
		/* The concat operator converts to string if operands are string or number */
		if (e->common_expr.type.type_code != RAVI_TSTRING &&
		    e->common_expr.type.type_code != RAVI_TNUMFLT &&
		    e->common_expr.type.type_code != RAVI_TNUMFLT) {
			node->common_expr.type.type_code = RAVI_TANY;
			break;
		}
	}
	END_FOR_EACH_PTR(node);
}